

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O3

lzma_filter_encoder * encoder_find(lzma_vli id)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(lzma_vli *)((long)&encoders[0].id + lVar1) == id) {
      return (lzma_filter_encoder *)((long)&encoders[0].id + lVar1);
    }
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0x1f8);
  return (lzma_filter_encoder *)0x0;
}

Assistant:

static const lzma_filter_encoder *
encoder_find(lzma_vli id)
{
	size_t i;
	for (i = 0; i < ARRAY_SIZE(encoders); ++i)
		if (encoders[i].id == id)
			return encoders + i;

	return NULL;
}